

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_flushStream(ZSTD_CStream *zcs,ZSTD_outBuffer *output)

{
  size_t sVar1;
  ZSTD_inBuffer *pZVar2;
  ZSTD_inBuffer input;
  ZSTD_inBuffer nullInput;
  
  nullInput.pos = 0;
  nullInput.src = (void *)0x0;
  nullInput.size = 0;
  pZVar2 = &zcs->expectedInBuffer;
  if ((zcs->appliedParams).inBufferMode != ZSTD_bm_stable) {
    pZVar2 = &nullInput;
  }
  input.size = pZVar2->pos;
  input.src = pZVar2->src;
  input.pos = input.size;
  sVar1 = ZSTD_compressStream2(zcs,output,&input,ZSTD_e_flush);
  return sVar1;
}

Assistant:

size_t ZSTD_flushStream(ZSTD_CStream* zcs, ZSTD_outBuffer* output)
{
    ZSTD_inBuffer input = inBuffer_forEndFlush(zcs);
    input.size = input.pos; /* do not ingest more input during flush */
    return ZSTD_compressStream2(zcs, output, &input, ZSTD_e_flush);
}